

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O2

void __thiscall
llm_graph_input_out_ids::set_input(llm_graph_input_out_ids *this,llama_ubatch *ubatch)

{
  uint uVar1;
  int *piVar2;
  int8_t *piVar3;
  char cVar4;
  int i;
  ulong uVar5;
  char *pcVar6;
  int i_1;
  int iVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  
  if ((this->hparams->causal_attn != false) ||
     (this->cparams->pooling_type == LLAMA_POOLING_TYPE_NONE)) {
    if (this->out_ids == (ggml_tensor *)0x0) {
      llama_log_internal(GGML_LOG_LEVEL_WARN,"%s: \'out_ids\' is not created\n","set_input");
      return;
    }
    uVar1 = ubatch->n_tokens;
    uVar10 = (ulong)uVar1;
    cVar4 = ggml_backend_buffer_is_host(this->out_ids->buffer);
    if (cVar4 == '\0') {
      pcVar6 = "ggml_backend_buffer_is_host(out_ids->buffer)";
      uVar8 = 0x7f;
LAB_001eaaa5:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,uVar8,"GGML_ASSERT(%s) failed",pcVar6);
    }
    piVar2 = (int *)this->out_ids->data;
    iVar7 = this->n_outputs;
    if ((long)iVar7 == uVar10) {
      for (uVar5 = 0; uVar10 != uVar5; uVar5 = uVar5 + 1) {
        piVar2[uVar5] = (int)uVar5;
      }
    }
    else {
      piVar3 = ubatch->output;
      if (piVar3 == (int8_t *)0x0) {
        if (iVar7 != 0) {
          if (iVar7 != 1) {
            pcVar6 = "n_outputs == 0";
            uVar8 = 0x93;
            goto LAB_001eaaa5;
          }
          *piVar2 = uVar1 - 1;
        }
      }
      else {
        iVar7 = 0;
        for (uVar5 = 0; uVar10 != uVar5; uVar5 = uVar5 + 1) {
          if (piVar3[uVar5] != '\0') {
            lVar9 = (long)iVar7;
            iVar7 = iVar7 + 1;
            piVar2[lVar9] = (int)uVar5;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void llm_graph_input_out_ids::set_input(const llama_ubatch * ubatch) {
    if (hparams.causal_attn || cparams.pooling_type == LLAMA_POOLING_TYPE_NONE) {
        //GGML_ASSERT(out_ids && "every model that can must skip unused outputs");

        if (!out_ids) {
            LLAMA_LOG_WARN("%s: 'out_ids' is not created\n", __func__);
        } else {
            const int64_t n_tokens = ubatch->n_tokens;

            GGML_ASSERT(ggml_backend_buffer_is_host(out_ids->buffer));
            int32_t * data = (int32_t *) out_ids->data;

            if (n_outputs == n_tokens) {
                for (int i = 0; i < n_tokens; ++i) {
                    data[i] = i;
                }
            } else if (ubatch->output) {
                int32_t n_outputs = 0;
                for (int i = 0; i < n_tokens; ++i) {
                    if (ubatch->output[i]) {
                        data[n_outputs++] = i;
                    }
                }
                // the graph needs to have been passed the correct number of outputs
                GGML_ASSERT(n_outputs == n_outputs);
            } else if (n_outputs == 1) {
                // only keep last output
                data[0] = n_tokens - 1;
            } else {
                GGML_ASSERT(n_outputs == 0);
            }
        }
    }
}